

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

int run_test_fs_chmod(void)

{
  uv_file file_00;
  int iVar1;
  uv_loop_t *puVar2;
  uv_buf_t uVar3;
  char *local_1e0;
  size_t local_1d8;
  undefined1 auStack_1c8 [4];
  uv_file file;
  uv_fs_t req;
  int r;
  
  unlink("test_file");
  loop = uv_default_loop();
  req.bufsml[3].len._4_4_ =
       uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_1c8,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  if (req.bufsml[3].len._4_4_ < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x612,"r >= 0");
    abort();
  }
  if ((long)req.cb < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x613,"req.result >= 0");
    abort();
  }
  file_00 = (uv_file)req.cb;
  uv_fs_req_cleanup((uv_fs_t *)auStack_1c8);
  uVar3 = uv_buf_init(test_buf,0xd);
  local_1e0 = uVar3.base;
  iov.base = local_1e0;
  local_1d8 = uVar3.len;
  iov.len = local_1d8;
  req.bufsml[3].len._4_4_ =
       uv_fs_write((uv_loop_t *)0x0,(uv_fs_t *)auStack_1c8,file_00,&iov,1,-1,(uv_fs_cb)0x0);
  if (req.bufsml[3].len._4_4_ != 0xd) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x619,"r == sizeof(test_buf)");
    abort();
  }
  if (req.cb != (uv_fs_cb)0xd) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x61a,"req.result == sizeof(test_buf)");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)auStack_1c8);
  req.bufsml[3].len._4_4_ =
       uv_fs_chmod((uv_loop_t *)0x0,(uv_fs_t *)auStack_1c8,"test_file",0x80,(uv_fs_cb)0x0);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x620,"r == 0");
    abort();
  }
  if (req.cb != (uv_fs_cb)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x621,"req.result == 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)auStack_1c8);
  check_permission("test_file",0x80);
  req.bufsml[3].len._4_4_ =
       uv_fs_chmod((uv_loop_t *)0x0,(uv_fs_t *)auStack_1c8,"test_file",0x100,(uv_fs_cb)0x0);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x629,"r == 0");
    abort();
  }
  if (req.cb != (uv_fs_cb)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x62a,"req.result == 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)auStack_1c8);
  check_permission("test_file",0x100);
  req.bufsml[3].len._4_4_ =
       uv_fs_fchmod((uv_loop_t *)0x0,(uv_fs_t *)auStack_1c8,file_00,0x180,(uv_fs_cb)0x0);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x631,"r == 0");
    abort();
  }
  if (req.cb != (uv_fs_cb)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x632,"req.result == 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)auStack_1c8);
  check_permission("test_file",0x180);
  _auStack_1c8 = &run_test_fs_chmod::mode;
  req.bufsml[3].len._4_4_ = uv_fs_chmod(loop,(uv_fs_t *)auStack_1c8,"test_file",0x80,chmod_cb);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x63e,"r == 0");
    abort();
  }
  uv_run(loop,UV_RUN_DEFAULT);
  if (chmod_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x640,"chmod_cb_count == 1");
    abort();
  }
  chmod_cb_count = 0;
  _auStack_1c8 = &run_test_fs_chmod::mode_1;
  req.bufsml[3].len._4_4_ = uv_fs_chmod(loop,(uv_fs_t *)auStack_1c8,"test_file",0x100,chmod_cb);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x64a,"r == 0");
    abort();
  }
  uv_run(loop,UV_RUN_DEFAULT);
  if (chmod_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x64c,"chmod_cb_count == 1");
    abort();
  }
  _auStack_1c8 = &run_test_fs_chmod::mode_2;
  req.bufsml[3].len._4_4_ = uv_fs_fchmod(loop,(uv_fs_t *)auStack_1c8,file_00,0x180,fchmod_cb);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x654,"r == 0");
    abort();
  }
  uv_run(loop,UV_RUN_DEFAULT);
  if (fchmod_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x656,"fchmod_cb_count == 1");
    abort();
  }
  uv_fs_close(loop,(uv_fs_t *)auStack_1c8,file_00,(uv_fs_cb)0x0);
  uv_run(loop,UV_RUN_DEFAULT);
  unlink("test_file");
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x663,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(fs_chmod) {
  int r;
  uv_fs_t req;
  uv_file file;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, "test_file", O_RDWR | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  file = req.result;
  uv_fs_req_cleanup(&req);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &req, file, &iov, 1, -1, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(req.result == sizeof(test_buf));
  uv_fs_req_cleanup(&req);

#ifndef _WIN32
  /* Make the file write-only */
  r = uv_fs_chmod(NULL, &req, "test_file", 0200, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  check_permission("test_file", 0200);
#endif

  /* Make the file read-only */
  r = uv_fs_chmod(NULL, &req, "test_file", 0400, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  check_permission("test_file", 0400);

  /* Make the file read+write with sync uv_fs_fchmod */
  r = uv_fs_fchmod(NULL, &req, file, 0600, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  check_permission("test_file", 0600);

#ifndef _WIN32
  /* async chmod */
  {
    static int mode = 0200;
    req.data = &mode;
  }
  r = uv_fs_chmod(loop, &req, "test_file", 0200, chmod_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(chmod_cb_count == 1);
  chmod_cb_count = 0; /* reset for the next test */
#endif

  /* async chmod */
  {
    static int mode = 0400;
    req.data = &mode;
  }
  r = uv_fs_chmod(loop, &req, "test_file", 0400, chmod_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(chmod_cb_count == 1);

  /* async fchmod */
  {
    static int mode = 0600;
    req.data = &mode;
  }
  r = uv_fs_fchmod(loop, &req, file, 0600, fchmod_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(fchmod_cb_count == 1);

  uv_fs_close(loop, &req, file, NULL);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}